

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_socket_open(Curl_easy *data,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,int transport,
                         curl_socket_t *sockfd)

{
  uint uVar1;
  int iVar2;
  CURLcode CVar3;
  int iVar4;
  Curl_sockaddr_ex *pCVar5;
  Curl_sockaddr_ex *addr_00;
  Curl_sockaddr_ex dummy;
  Curl_sockaddr_ex local_a8;
  
  addr_00 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    addr_00 = &local_a8;
  }
  addr_00->family = ai->ai_family;
  iVar2 = 1;
  if (transport == 3) {
    iVar4 = 6;
  }
  else if (transport == 6) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0x11;
    iVar2 = 2;
  }
  pCVar5 = &local_a8;
  if (addr != (Curl_sockaddr_ex *)0x0) {
    pCVar5 = addr;
  }
  pCVar5->socktype = iVar2;
  pCVar5->protocol = iVar4;
  uVar1 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar1 = ai->ai_addrlen;
  }
  pCVar5->addrlen = uVar1;
  memcpy(&pCVar5->_sa_ex_u,ai->ai_addr,(ulong)uVar1);
  CVar3 = socket_open(data,addr_00,sockfd);
  return CVar3;
}

Assistant:

CURLcode Curl_socket_open(struct Curl_easy *data,
                            const struct Curl_addrinfo *ai,
                            struct Curl_sockaddr_ex *addr,
                            int transport,
                            curl_socket_t *sockfd)
{
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  Curl_sock_assign_addr(addr, ai, transport);
  return socket_open(data, addr, sockfd);
}